

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

size_t __thiscall
cmGlobalUnixMakefileGenerator3::CountProgressMarksInTarget
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratorTarget *target,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  bool bVar1;
  TargetType TVar2;
  mapped_type *pmVar3;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_00;
  reference this_01;
  cmGeneratorTarget *pcVar4;
  size_t sVar5;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar6;
  cmTargetDepend *depend;
  iterator __end2;
  iterator __begin2;
  TargetDependSet *__range2;
  size_type local_28;
  size_t count;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *emitted_local;
  cmGeneratorTarget *target_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  local_28 = 0;
  emitted_local =
       (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        *)target;
  target_local = (cmGeneratorTarget *)this;
  pVar6 = std::
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::insert(emitted,(value_type *)&emitted_local);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pmVar3 = std::
             map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
             ::operator[](&this->ProgressMap,(key_type *)&emitted_local);
    local_28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pmVar3->Marks);
    this_00 = &cmGlobalGenerator::GetTargetDirectDepends
                         ((cmGlobalGenerator *)this,(cmGeneratorTarget *)emitted_local)->
               super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
    ;
    __end2 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
             begin(this_00);
    depend = (cmTargetDepend *)
             std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
             end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&depend), bVar1) {
      this_01 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end2);
      pcVar4 = cmTargetDepend::operator->(this_01);
      TVar2 = cmGeneratorTarget::GetType(pcVar4);
      if (TVar2 != INTERFACE_LIBRARY) {
        pcVar4 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(this_01);
        sVar5 = CountProgressMarksInTarget(this,pcVar4,emitted);
        local_28 = sVar5 + local_28;
      }
      std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end2);
    }
  }
  return local_28;
}

Assistant:

size_t cmGlobalUnixMakefileGenerator3::CountProgressMarksInTarget(
  cmGeneratorTarget const* target, std::set<cmGeneratorTarget const*>& emitted)
{
  size_t count = 0;
  if (emitted.insert(target).second) {
    count = this->ProgressMap[target].Marks.size();
    for (cmTargetDepend const& depend : this->GetTargetDirectDepends(target)) {
      if (depend->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      count += this->CountProgressMarksInTarget(depend, emitted);
    }
  }
  return count;
}